

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * make_ARB1_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  uint uVar1;
  SourceMod SVar2;
  MOJOSHADER_shaderType shader_type;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  RegisterType rtype;
  uint uVar10;
  ulong *puVar11;
  size_t in_R8;
  uint uVar12;
  ulong uVar13;
  char acStack_128 [56];
  code *pcStack_f0;
  char acStack_e8 [56];
  undefined8 uStack_b0;
  ulong uStack_a8;
  char rel_offset [32];
  char regnum_str [16];
  char *local_70;
  char local_68 [8];
  char swizzle_str [6];
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  char *pcStack_38;
  char rel_swizzle [4];
  
  rel_offset[0x18] = '\0';
  rel_offset[0x19] = '\0';
  rel_offset[0x1a] = '\0';
  rel_offset[0x1b] = '\0';
  rel_offset[0x1c] = '\0';
  rel_offset[0x1d] = '\0';
  rel_offset[0x1e] = '\0';
  rel_offset[0x1f] = '\0';
  if (arg->relative == 0) {
    uStack_b0 = 0x11d6b4;
    local_48 = get_D3D_register_string(ctx,arg->regtype,arg->regnum,rel_offset + 0x18,in_R8);
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    uStack_a8 = 0;
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    local_3c = 0;
    if (arg->relative != 0) goto LAB_0011d6d7;
    local_58 = "";
    local_70 = "";
    regnum_str._8_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
    puVar11 = &uStack_a8;
  }
  else {
LAB_0011d6d7:
    local_3c = 0;
    rel_offset[0x10] = '\0';
    rel_offset[0x11] = '\0';
    rel_offset[0x12] = '\0';
    rel_offset[0x13] = '\0';
    rel_offset[0x14] = '\0';
    rel_offset[0x15] = '\0';
    rel_offset[0x16] = '\0';
    rel_offset[0x17] = '\0';
    rel_offset[8] = '\0';
    rel_offset[9] = '\0';
    rel_offset[10] = '\0';
    rel_offset[0xb] = '\0';
    rel_offset[0xc] = '\0';
    rel_offset[0xd] = '\0';
    rel_offset[0xe] = '\0';
    rel_offset[0xf] = '\0';
    rel_offset[0] = '\0';
    rel_offset[1] = '\0';
    rel_offset[2] = '\0';
    rel_offset[3] = '\0';
    rel_offset[4] = '\0';
    rel_offset[5] = '\0';
    rel_offset[6] = '\0';
    rel_offset[7] = '\0';
    uStack_a8 = 0;
    local_58 = acStack_e8;
    pcStack_f0 = (code *)0x11d6f8;
    pcVar7 = get_D3D_register_string(ctx,arg->relative_regtype,arg->relative_regnum,local_68,in_R8);
    pcStack_f0 = (code *)0x11d714;
    snprintf(local_58,0x40,"%s%s",pcVar7,local_68);
    uVar4 = local_3c;
    local_3c._0_2_ = CONCAT11("xyzw"[arg->relative_component],0x2e);
    local_3c._3_1_ = SUB41(uVar4,3);
    local_3c._0_3_ = (uint3)(ushort)local_3c;
    if (ctx->profile_supports_nv2 == 0) {
      if (arg->relative_regtype != REG_TYPE_ADDRESS) {
        pcStack_f0 = (code *)0x11dcbc;
        __assert_fail("arg->relative_regtype == REG_TYPE_ADDRESS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x193f,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (arg->relative_regnum != 0) {
        pcStack_f0 = get_ARB1_destarg_varname;
        __assert_fail("arg->relative_regnum == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1940,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (ctx->last_address_reg_component != arg->relative_component) {
        pcStack_f0 = (code *)0x11d771;
        output_line(ctx,"ARL %s.x, addr%d.%c;",local_58,0);
        ctx->last_address_reg_component = arg->relative_component;
      }
      local_3c._0_2_ = CONCAT11(0x78,(undefined1)local_3c);
    }
    regnum_str._8_8_ = anon_var_dwarf_3d8b;
    local_70 = "]";
    if (arg->regtype == REG_TYPE_INPUT) {
      local_48 = "vertex.attrib";
      puVar11 = (ulong *)local_58;
    }
    else {
      pcStack_38 = buf;
      if (arg->regtype != REG_TYPE_CONST) {
        pcStack_f0 = (code *)0x11dc7e;
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1950,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      uVar1 = arg->relative_array->index;
      uVar10 = arg->regnum;
      uVar12 = uVar10 - uVar1;
      if ((int)uVar12 < 0) {
        pcStack_f0 = (code *)0x11dc9d;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1954,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      local_48 = acStack_128;
      snprintf(local_48,0x40,"c_array_%d_%d",(ulong)uVar1,(ulong)(uint)arg->relative_array->count);
      puVar11 = (ulong *)local_48;
      buf = pcStack_38;
      if (uVar10 != uVar1) {
        snprintf((char *)&uStack_a8,0x20," + %d",(ulong)uVar12);
        buf = pcStack_38;
      }
    }
  }
  *(char **)((long)puVar11 + -8) = local_70;
  *(ulong **)((long)puVar11 + -0x10) = &uStack_a8;
  *(undefined4 **)((long)puVar11 + -0x18) = &local_3c;
  *(char **)((long)puVar11 + -0x20) = local_58;
  *(char *)((long)puVar11 + -0x28) = 'y';
  *(char *)((long)puVar11 + -0x27) = -0x28;
  *(char *)((long)puVar11 + -0x26) = '\x11';
  *(char *)((long)puVar11 + -0x25) = '\0';
  *(char *)((long)puVar11 + -0x24) = '\0';
  *(char *)((long)puVar11 + -0x23) = '\0';
  *(char *)((long)puVar11 + -0x22) = '\0';
  *(char *)((long)puVar11 + -0x21) = '\0';
  snprintf(buf,0x40,"%s%s%s%s%s%s%s",local_48,rel_offset + 0x18,regnum_str._8_8_);
  SVar2 = arg->src_mod;
  if (SRCMOD_NEGATE < SVar2) {
    if ((SVar2 != SRCMOD_ABS) || (ctx->profile_supports_nv2 == 0)) {
      local_48 = (char *)((long)puVar11 + -0x40);
      iVar6 = ctx->scratch_registers;
      iVar5 = iVar6 + 1;
      ctx->scratch_registers = iVar5;
      if (ctx->max_scratch_registers <= iVar6) {
        ctx->max_scratch_registers = iVar5;
      }
      *(char *)((long)puVar11 + -0x48) = -6;
      *(char *)((long)puVar11 + -0x47) = -0x28;
      *(char *)((long)puVar11 + -0x46) = '\x11';
      *(char *)((long)puVar11 + -0x45) = '\0';
      *(char *)((long)puVar11 + -0x44) = '\0';
      *(char *)((long)puVar11 + -0x43) = '\0';
      *(char *)((long)puVar11 + -0x42) = '\0';
      *(char *)((long)puVar11 + -0x41) = '\0';
      pcStack_38 = buf;
      snprintf(local_48,0x40,"scratch%d");
      rel_offset._24_8_ = rel_offset._24_8_ & 0xffffffffffffff00;
      uStack_a8 = uStack_a8 & 0xffffffffffffff00;
      local_3c = local_3c & 0xffffff00;
      local_70 = "";
      local_58 = "";
      regnum_str._8_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
      puVar11 = (ulong *)local_48;
      buf = pcStack_38;
      goto LAB_0011d923;
    }
    pcVar7 = "";
    goto switchD_0011d948_caseD_b;
  }
LAB_0011d923:
  pcVar7 = "";
  pcVar9 = "";
  switch(SVar2) {
  case SRCMOD_NEGATE:
    pcStack_38 = "-";
    goto LAB_0011da00;
  case SRCMOD_BIASNEGATE:
    pcVar9 = "-";
  case SRCMOD_BIAS:
    pcVar7 = "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };";
    pcStack_38 = pcVar9;
    goto LAB_0011da66;
  case SRCMOD_SIGNNEGATE:
    pcVar9 = "-";
  case SRCMOD_SIGN:
    pcVar7 = "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };";
    pcStack_38 = pcVar9;
    goto LAB_0011da66;
  case SRCMOD_COMPLEMENT:
    *(char *)((long)puVar11 + -8) = -0x66;
    *(char *)((long)puVar11 + -7) = -0x26;
    *(char *)((long)puVar11 + -6) = '\x11';
    *(char *)((long)puVar11 + -5) = '\0';
    *(char *)((long)puVar11 + -4) = '\0';
    *(char *)((long)puVar11 + -3) = '\0';
    *(char *)((long)puVar11 + -2) = '\0';
    *(char *)((long)puVar11 + -1) = '\0';
    output_line(ctx,"SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",local_48,buf);
    local_50 = "";
    pcStack_38 = "";
    break;
  case SRCMOD_X2NEGATE:
    pcVar9 = "-";
  case SRCMOD_X2:
    pcVar7 = "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };";
    pcStack_38 = pcVar9;
LAB_0011da66:
    local_50 = "";
    *(char *)((long)puVar11 + -8) = 'z';
    *(char *)((long)puVar11 + -7) = -0x26;
    *(char *)((long)puVar11 + -6) = '\x11';
    *(char *)((long)puVar11 + -5) = '\0';
    *(char *)((long)puVar11 + -4) = '\0';
    *(char *)((long)puVar11 + -3) = '\0';
    *(char *)((long)puVar11 + -2) = '\0';
    *(char *)((long)puVar11 + -1) = '\0';
    output_line(ctx,pcVar7,local_48,buf);
    break;
  case SRCMOD_DZ:
    *(char *)((long)puVar11 + -8) = -0x2f;
    *(char *)((long)puVar11 + -7) = -0x26;
    *(char *)((long)puVar11 + -6) = '\x11';
    *(char *)((long)puVar11 + -5) = '\0';
    *(char *)((long)puVar11 + -4) = '\0';
    *(char *)((long)puVar11 + -3) = '\0';
    *(char *)((long)puVar11 + -2) = '\0';
    *(char *)((long)puVar11 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_DZ currently unsupported in arb1");
    pcStack_38 = "";
    local_50 = "_dz";
    break;
  case SRCMOD_DW:
    *(char *)((long)puVar11 + -8) = '(';
    *(char *)((long)puVar11 + -7) = -0x26;
    *(char *)((long)puVar11 + -6) = '\x11';
    *(char *)((long)puVar11 + -5) = '\0';
    *(char *)((long)puVar11 + -4) = '\0';
    *(char *)((long)puVar11 + -3) = '\0';
    *(char *)((long)puVar11 + -2) = '\0';
    *(char *)((long)puVar11 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_DW currently unsupported in arb1");
    pcStack_38 = "";
    local_50 = "_dw";
    break;
  case SRCMOD_ABS:
    goto switchD_0011d948_caseD_b;
  case SRCMOD_ABSNEGATE:
    pcVar7 = "-";
    goto switchD_0011d948_caseD_b;
  case SRCMOD_NOT:
    *(char *)((long)puVar11 + -8) = -7;
    *(char *)((long)puVar11 + -7) = -0x27;
    *(char *)((long)puVar11 + -6) = '\x11';
    *(char *)((long)puVar11 + -5) = '\0';
    *(char *)((long)puVar11 + -4) = '\0';
    *(char *)((long)puVar11 + -3) = '\0';
    *(char *)((long)puVar11 + -2) = '\0';
    *(char *)((long)puVar11 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_NOT currently unsupported in arb1");
    pcStack_38 = "!";
LAB_0011da00:
    local_50 = "";
    break;
  default:
    local_50 = "";
    pcStack_38 = "";
  }
LAB_0011dae0:
  rtype = arg->regtype;
  bVar3 = true;
  if ((rtype == REG_TYPE_MISCTYPE && ctx->profile_supports_nv4 != 0) &&
     (rtype = REG_TYPE_MISCTYPE, arg->regnum == 1)) {
    local_68[0] = '.';
    local_68[1] = 'x';
    uVar13 = 2;
    bVar3 = false;
  }
  else {
    uVar13 = 0;
  }
  shader_type = ctx->shader_type;
  iVar6 = arg->regnum;
  *(undefined8 *)((long)puVar11 + -8) = 0x11db32;
  iVar6 = isscalar(ctx,shader_type,rtype,iVar6);
  if ((iVar6 == 0) && (uVar1 = arg->swizzle, uVar1 != 0xe4)) {
    uVar8 = uVar13 | 1;
    local_68[uVar13] = '.';
    uVar10 = uVar1 & 3;
    if ((uVar10 != (uVar1 >> 2 & 3)) ||
       ((uVar10 != (uVar1 >> 4 & 3) || (uVar10 != (uVar1 >> 6 & 3))))) {
      local_68[uVar8] = "xyzw"[arg->swizzle_x];
      local_68[uVar13 + 2] = "xyzw"[arg->swizzle_y];
      local_68[uVar13 + 3] = "xyzw"[arg->swizzle_z];
      local_68[uVar13 + 4] = "xyzw"[arg->swizzle_w];
      local_68[uVar13 + 5] = '\0';
      if (!bVar3) {
        *(undefined8 *)((long)puVar11 + -8) = 0x11dc5f;
        __assert_fail("i < sizeof (swizzle_str)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x19de,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      goto LAB_0011db50;
    }
    uVar13 = uVar13 + 2;
    local_68[uVar8] = "xyzw"[arg->swizzle_x];
  }
  local_68[uVar13] = '\0';
LAB_0011db50:
  *(char **)((long)puVar11 + -0x10) = local_50;
  *(char **)((long)puVar11 + -0x18) = local_68;
  *(char **)((long)puVar11 + -0x20) = local_70;
  *(ulong **)((long)puVar11 + -0x28) = &uStack_a8;
  *(undefined4 **)((long)puVar11 + -0x30) = &local_3c;
  *(char **)((long)puVar11 + -0x38) = local_58;
  *(undefined8 *)((long)puVar11 + -0x40) = regnum_str._8_8_;
  *(undefined8 *)((long)puVar11 + -0x48) = 0x11db8f;
  snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s%s",pcStack_38,local_48,rel_offset + 0x18);
  return buf;
switchD_0011d948_caseD_b:
  if (ctx->profile_supports_nv2 == 0) {
    *(undefined8 *)((long)puVar11 + -8) = 0x11d9b2;
    pcStack_38 = pcVar7;
    output_line(ctx,"ABS %s, %s;",local_48,buf);
    local_50 = "";
  }
  else {
    pcStack_38 = "-|";
    local_50 = "|";
    if (SVar2 != SRCMOD_ABSNEGATE) {
      pcStack_38 = "|";
    }
  }
  goto LAB_0011dae0;
}

Assistant:

static const char *make_ARB1_srcarg_string_in_buf(Context *ctx,
                                                  const SourceArgInfo *arg,
                                                  char *buf, size_t buflen)
{
    // !!! FIXME: this can hit pathological cases where we look like this...
    //
    //    dp3 r1.xyz, t0_bx2, t0_bx2
    //    mad r1.xyz, t0_bias, 1-r1, t0_bx2
    //
    // ...which do a lot of duplicate work in arb1...
    //
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch0, scratch0, { 2.0, 2.0, 2.0, 2.0 };
    //    SUB scratch1, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch1, scratch1, { 2.0, 2.0, 2.0, 2.0 };
    //    DP3 r1.xyz, scratch0, scratch1;
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    SUB scratch1, { 1.0, 1.0, 1.0, 1.0 }, r1;
    //    SUB scratch2, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch2, scratch2, { 2.0, 2.0, 2.0, 2.0 };
    //    MAD r1.xyz, scratch0, scratch1, scratch2;
    //
    // ...notice that the dp3 calculates the same value into two scratch
    //  registers. This case is easier to handle; just see if multiple
    //  source args are identical, build it up once, and use the same
    //  scratch register for multiple arguments in that opcode.
    //  Even better still, only calculate things once across instructions,
    //  and be smart about letting it linger in a scratch register until we
    //  definitely don't need the calculation anymore. That's harder to
    //  write, though.

    char regnum_str[16] = { '\0' };

    // !!! FIXME: use get_ARB1_varname_in_buf() instead?
    const char *regtype_str = NULL;
    if (!arg->relative)
    {
        regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                               arg->regnum, regnum_str,
                                               sizeof (regnum_str));
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_regtype_str = get_ARB1_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);

        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';

        if (!support_nv2(ctx))
        {
            // The address register in ARB1 only allows the '.x' component, so
            //  we need to load the component we need from a temp vector
            //  register into .x as needed.
            assert(arg->relative_regtype == REG_TYPE_ADDRESS);
            assert(arg->relative_regnum == 0);
            if (ctx->last_address_reg_component != arg->relative_component)
            {
                output_line(ctx, "ARL %s.x, addr%d.%c;", rel_regtype_str,
                            arg->relative_regnum,
                            swizzle_channels[arg->relative_component]);
                ctx->last_address_reg_component = arg->relative_component;
            } // if

            rel_swizzle[1] = 'x';
        } // if

        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str = "vertex.attrib";
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int arraysize = arg->relative_array->count;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            regtype_str = get_ARB1_const_array_varname_in_buf(ctx, arrayidx,
                                           arraysize, (char *) alloca(64), 64);
            if (offset != 0)
                snprintf(rel_offset, sizeof (rel_offset), " + %d", offset);
        } // else

        rel_lbracket = "[";
        rel_rbracket = "]";
    } // if

    // This is the source register with everything but swizzle and source mods.
    snprintf(buf, buflen, "%s%s%s%s%s%s%s", regtype_str, regnum_str,
             rel_lbracket, rel_regtype_str, rel_swizzle, rel_offset,
             rel_rbracket);

    // Some of the source mods need to generate instructions to a temp
    //  register, in which case we'll replace the register name.
    const SourceMod mod = arg->src_mod;
    const int inplace = ( (mod == SRCMOD_NONE) || (mod == SRCMOD_NEGATE) ||
                          ((mod == SRCMOD_ABS) && support_nv2(ctx)) );

    if (!inplace)
    {
        const size_t len = 64;
        char *stackbuf = (char *) alloca(len);
        regtype_str = allocate_ARB1_scratch_reg_name(ctx, stackbuf, len);
        regnum_str[0] = '\0'; // move value to scratch register.
        rel_lbracket = "";   // scratch register won't use array.
        rel_rbracket = "";
        rel_offset[0] = '\0';
        rel_swizzle[0] = '\0';
        rel_regtype_str = "";
    } // if

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            output_line(ctx, "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",
                        regtype_str, buf);
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            output_line(ctx,
                "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };",
                regtype_str, buf);
            break;

        case SRCMOD_COMPLEMENT:
            output_line(ctx, "SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",
                        regtype_str, buf);
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",
                        regtype_str, buf);
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ currently unsupported in arb1");
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW currently unsupported in arb1");
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            if (!support_nv2(ctx))  // GL_NV_vertex_program2_option adds this.
                output_line(ctx, "ABS %s, %s;", regtype_str, buf);
            else
            {
                premod_str = (mod == SRCMOD_ABSNEGATE) ? "-|" : "|";
                postmod_str = "|";
            } // else
            break;

        case SRCMOD_NOT:
            fail(ctx, "SRCMOD_NOT currently unsupported in arb1");
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    char swizzle_str[6];
    size_t i = 0;

    if (support_nv4(ctx))  // vFace must be output as "vFace.x" in nv4.
    {
        if (arg->regtype == REG_TYPE_MISCTYPE)
        {
            if ( ((const MiscTypeType) arg->regnum) == MISCTYPE_TYPE_FACE )
            {
                swizzle_str[i++] = '.';
                swizzle_str[i++] = 'x';
            } // if
        } // if
    } // if

    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';

        // .xxxx is the same as .x, but .xx is illegal...scalar or full!
        if (replicate_swizzle(arg->swizzle))
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        else
        {
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_w];
        } // else
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s", premod_str,
             regtype_str, regnum_str, rel_lbracket,
             rel_regtype_str, rel_swizzle, rel_offset, rel_rbracket,
             swizzle_str, postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}